

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O0

void __thiscall
VW::object_pool<example,_example_initializer>::return_object
          (object_pool<example,_example_initializer> *this,example *obj)

{
  mutex_type *in_RDI;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd0,in_RDI);
  std::queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_>::push
            ((queue<example_*,_std::deque<example_*,_std::allocator<example_*>_>_> *)
             in_stack_ffffffffffffffd0,(value_type *)in_RDI);
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void return_object(T* obj)
  {
    std::unique_lock<std::mutex> lock(m_lock);
    assert(is_from_pool(obj));
    m_pool.push(obj);
  }